

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

bool Imf_2_5::isValidDeepCompression(Compression c)

{
  Compression c_local;
  
  return c < ZIP_COMPRESSION;
}

Assistant:

bool isValidDeepCompression(Compression c)
{
  switch(c)
  {
      case NO_COMPRESSION:
      case RLE_COMPRESSION:
      case ZIPS_COMPRESSION:
          return true;
      default :
          return false;
  }
}